

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thin_server.c
# Opt level: O3

void thin_data_available(void *cmv,void *conn_datav)

{
  int iVar1;
  int iVar2;
  undefined8 in_RAX;
  long *plVar3;
  char *__s1;
  undefined8 uVar4;
  size_t size;
  void *pvVar5;
  void *pvVar6;
  EVsource p_Var7;
  undefined8 uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int tmp_stone;
  undefined4 local_34;
  
  local_34 = (undefined4)((ulong)in_RAX >> 0x20);
  IntCManager_unlock((CManager)cmv,
                     "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/thin_server.c"
                     ,0x9d);
  iVar1 = FFSnext_record_type(*conn_datav);
  if (iVar1 < 8) {
    if (iVar1 - 1U < 2) {
      close_FFSfile(*conn_datav);
      free_FFSfile(*conn_datav);
      iVar1 = *(int *)((long)conn_datav + 0x10);
      if (0 < iVar1) {
        lVar12 = 0;
        do {
          plVar3 = *(long **)(*(long *)((long)conn_datav + 0x18) + lVar12 * 8);
          if (plVar3 != (long *)0x0) {
            pvVar5 = (void *)*plVar3;
            if (pvVar5 != (void *)0x0) {
              lVar10 = 0;
              do {
                free(pvVar5);
                lVar11 = lVar10 * 0x20;
                plVar3 = *(long **)(*(long *)(*(long *)((long)conn_datav + 0x18) + lVar12 * 8) + 8 +
                                   lVar11);
                pvVar5 = (void *)*plVar3;
                if (pvVar5 != (void *)0x0) {
                  lVar9 = 0;
                  do {
                    free(pvVar5);
                    free(*(void **)(*(long *)(*(long *)(*(long *)((long)conn_datav + 0x18) +
                                                       lVar12 * 8) + 8 + lVar11) + 8 + lVar9));
                    plVar3 = *(long **)(*(long *)(*(long *)((long)conn_datav + 0x18) + lVar12 * 8) +
                                        8 + lVar11);
                    pvVar5 = *(void **)((long)plVar3 + lVar9 + 0x18);
                    lVar9 = lVar9 + 0x18;
                  } while (pvVar5 != (void *)0x0);
                }
                free(plVar3);
                lVar10 = lVar10 + 1;
                plVar3 = *(long **)(*(long *)((long)conn_datav + 0x18) + lVar12 * 8);
                pvVar5 = (void *)plVar3[lVar10 * 4];
              } while (pvVar5 != (void *)0x0);
            }
            free(plVar3);
            iVar1 = *(int *)((long)conn_datav + 0x10);
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < iVar1);
      }
      free(*(void **)((long)conn_datav + 0x18));
      iVar1 = *(int *)((long)conn_datav + 0x20);
      if (-1 < iVar1) {
        lVar12 = -1;
        do {
          p_Var7 = *(EVsource *)(*(long *)((long)conn_datav + 0x28) + 8 + lVar12 * 8);
          if (p_Var7 != (EVsource)0x0) {
            EVfree_source(p_Var7);
            iVar1 = *(int *)((long)conn_datav + 0x20);
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < iVar1);
      }
      free(*(void **)((long)conn_datav + 0x28));
      CM_fd_remove_select((CManager_conflict)cmv,*(int *)((long)conn_datav + 8));
      free(conn_datav);
    }
    else if (iVar1 == 4) {
      uVar4 = FFSnext_type_handle(*conn_datav);
      size = FFSnext_data_length(*conn_datav);
      uVar4 = FMFormat_of_original(uVar4);
      iVar1 = FMformat_index(uVar4);
      pvVar5 = INT_CMmalloc(size);
      FFSread(*conn_datav,pvVar5);
      if (*(int *)((long)conn_datav + 0x20) < iVar1) {
        pvVar6 = INT_CMrealloc(*(void **)((long)conn_datav + 0x28),(long)(iVar1 + 1) * 8);
        *(void **)((long)conn_datav + 0x28) = pvVar6;
        memset((void *)((long)pvVar6 + (long)*(int *)((long)conn_datav + 0x20) * 8),0,
               (long)((iVar1 + 1) - *(int *)((long)conn_datav + 0x20)) << 3);
        *(int *)((long)conn_datav + 0x20) = iVar1;
      }
      lVar12 = (long)iVar1;
      p_Var7 = *(EVsource *)(*(long *)((long)conn_datav + 0x28) + lVar12 * 8);
      if (p_Var7 == (EVsource)0x0) {
        p_Var7 = EVcreate_submit_handle_free
                           ((CManager)cmv,*(EVstone *)((long)conn_datav + 0xc),
                            *(FMStructDescList *)(*(long *)((long)conn_datav + 0x18) + lVar12 * 8),
                            thin_free_func,conn_datav);
        *(EVsource *)(*(long *)((long)conn_datav + 0x28) + lVar12 * 8) = p_Var7;
        p_Var7 = *(EVsource *)(*(long *)((long)conn_datav + 0x28) + lVar12 * 8);
      }
      EVsubmit(p_Var7,pvVar5,(attr_list)0x0);
    }
  }
  else if (iVar1 == 8) {
    uVar4 = FFSread_format(*conn_datav);
    uVar4 = FMFormat_of_original(uVar4);
    uVar4 = get_localized_formats(uVar4);
    uVar8 = FFSContext_of_file(*conn_datav);
    uVar8 = FFSset_fixed_target(uVar8,uVar4);
    uVar8 = FMFormat_of_original(uVar8);
    iVar1 = FMformat_index(uVar8);
    pvVar5 = *(void **)((long)conn_datav + 0x18);
    if (pvVar5 == (void *)0x0) {
      pvVar5 = INT_CMmalloc(8);
      *(void **)((long)conn_datav + 0x18) = pvVar5;
      *(undefined4 *)((long)conn_datav + 0x10) = 1;
      iVar2 = 1;
    }
    else {
      iVar2 = *(int *)((long)conn_datav + 0x10);
    }
    if (iVar2 < iVar1) {
      iVar2 = iVar1 + 1;
      pvVar5 = INT_CMrealloc(pvVar5,(long)iVar2 * 8);
      *(void **)((long)conn_datav + 0x18) = pvVar5;
      memset((void *)((long)pvVar5 + (long)*(int *)((long)conn_datav + 0x10) * 8),0,
             (long)(iVar2 - *(int *)((long)conn_datav + 0x10)) << 3);
      *(int *)((long)conn_datav + 0x10) = iVar2;
      pvVar5 = *(void **)((long)conn_datav + 0x18);
    }
    *(undefined8 *)((long)pvVar5 + (long)iVar1 * 8) = uVar4;
  }
  else if (iVar1 == 0x10) {
    __s1 = (char *)FFSread_comment(*conn_datav);
    iVar1 = strncmp(__s1,"Stone ",6);
    if (iVar1 == 0) {
      iVar1 = __isoc99_sscanf(__s1,"Stone %d",&local_34);
      if (iVar1 == 1) {
        *(undefined4 *)((long)conn_datav + 0xc) = local_34;
      }
    }
  }
  IntCManager_lock((CManager)cmv,
                   "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/thin_server.c"
                   ,0xf7);
  return;
}

Assistant:

static void
thin_data_available(void *cmv, void * conn_datav)
{
    thin_conn_data cd = conn_datav;
    CManager cm = (CManager) cmv;
    int i;

    CManager_unlock(cm);
    switch(FFSnext_record_type(cd->ffsfile)) {
    case FFSindex:
	break;
    case FFSend:
    case FFSerror:
	close_FFSfile(cd->ffsfile);
	free_FFSfile(cd->ffsfile);
	for (i=0; i < cd->format_count; i++) {
	    int j = 0;
	    if (cd->format_list[i] == NULL) continue;
	    while((cd->format_list[i])[j].format_name != NULL) {
		int k = 0;
		free((void*)cd->format_list[i][j].format_name);
		while (cd->format_list[i][j].field_list[k].field_name != NULL) {
		    free((char*)cd->format_list[i][j].field_list[k].field_name);
		    free((char*)cd->format_list[i][j].field_list[k].field_type);
		    k++;
		}
		free(cd->format_list[i][j].field_list);
		j++;
	    }
	    free(cd->format_list[i]);
	}
	free(cd->format_list);
	for (i=0; i <= cd->max_src_list; i++) {
	    if (cd->src_list[i] != NULL) {
		EVfree_source(cd->src_list[i]);
	    }
	}
	free(cd->src_list);
	CM_fd_remove_select(cm, cd->fd);
	free(cd);
	break;
    case FFSformat: {
	FFSTypeHandle next_format = FFSread_format(cd->ffsfile);
	FMStructDescList formats = 
	    get_localized_formats(FMFormat_of_original(next_format));
	FFSTypeHandle target = 
	    FFSset_fixed_target(FFSContext_of_file(cd->ffsfile), 
				formats);
	int format_num = FMformat_index(FMFormat_of_original(target));
	if (cd->format_list == NULL) {
	    cd->format_list = malloc(sizeof(cd->format_list[0]));
	    cd->format_count = 1;
	}
	if (cd->format_count < format_num) {
	    cd->format_list = 
		realloc(cd->format_list, 
			(format_num + 1) * sizeof(cd->format_list[0]));
	    memset(cd->format_list + cd->format_count, 0,
		   sizeof(cd->format_list[0]) * (format_num -cd->format_count +1));
	    cd->format_count = format_num + 1;
	}
	cd->format_list[format_num] = formats;
	break;
    }
    case FFSdata: {
	FFSTypeHandle next_format = FFSnext_type_handle(cd->ffsfile);
	size_t len = FFSnext_data_length(cd->ffsfile);
	int format_num = FMformat_index(FMFormat_of_original(next_format));
	void *data = malloc(len);
	FFSread(cd->ffsfile, data);
	if (cd->max_src_list < format_num) {
	    cd->src_list = realloc(cd->src_list, 
				   (format_num+1) * sizeof(cd->src_list[0]));
	    memset(&cd->src_list[cd->max_src_list], 0,
		   (format_num - cd->max_src_list + 1) * sizeof(cd->src_list[0]));
	    cd->max_src_list = format_num;
	}
	if (cd->src_list[format_num] == NULL) {
	    cd->src_list[format_num] = 
		EVcreate_submit_handle_free(cm, cd->target_stone, 
					    cd->format_list[format_num],
					    thin_free_func, cd);
	}
	EVsubmit(cd->src_list[format_num], data, NULL);
	break;
    }
    case FFScomment: {
	char *comment = FFSread_comment(cd->ffsfile);
	if (strncmp(comment, "Stone ", 6) == 0) {
	    int tmp_stone;
	    if (sscanf(comment, "Stone %d", &tmp_stone) == 1) {
		cd->target_stone = tmp_stone;
	    }
	}
	break;
    }
    }
    CManager_lock(cm);
}